

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O1

void __thiscall
CTcSymMetaclass::gen_code_member
          (CTcSymMetaclass *this,int discard,CTcPrsNode *prop_expr,int prop_is_expr,int argc,
          int varargs,CTcNamedArgs *named_args)

{
  if (((this->super_CTcSymMetaclassBase).field_0x58 & 1) == 0) {
    (*(this->super_CTcSymMetaclassBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
      super_CVmHashEntry._vptr_CVmHashEntry[0x18])(this,0);
    if (varargs != 0) {
      CTcGenTarg::write_op(G_cg,0x8d);
    }
    CTcPrsNode::s_gen_member_rhs(discard,prop_expr,prop_is_expr,argc,varargs,named_args);
    return;
  }
  CTcTokenizer::log_error
            (0x2d2d,(ulong)(uint)(this->super_CTcSymMetaclassBase).super_CTcSymbol.
                                 super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.len_,
             (this->super_CTcSymMetaclassBase).super_CTcSymbol.super_CTcSymbolBase.
             super_CVmHashEntryCS.super_CVmHashEntry.str_);
  return;
}

Assistant:

void CTcSymMetaclass::gen_code_member(int discard, CTcPrsNode *prop_expr,
                                      int prop_is_expr,
                                      int argc, int varargs,
                                      CTcNamedArgs *named_args)
{
    /* if this is an external metaclass, we can't generate code */
    if (ext_)
    {
        G_tok->log_error(TCERR_EXT_METACLASS, (int)get_sym_len(), get_sym());
        return;
    }

    /* generate code to push our class object onto the stack */
    gen_code(FALSE);

    /* if we have an argument counter, put it back on top */
    if (varargs)
        G_cg->write_op(OPC_SWAP);

    /* use the standard member generation */
    CTcPrsNode::s_gen_member_rhs(discard, prop_expr, prop_is_expr,
                                 argc, varargs, named_args);
}